

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::ShapeOrder
               (TPZVec<long> *id,TPZVec<int> *order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  int *piVar2;
  int64_t iVar3;
  TPZGenMatrix<int> *in_RDX;
  TPZVec<int> *in_RSI;
  int i;
  int nshape;
  size_t in_stack_000003f8;
  char *in_stack_00000400;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  int iVar5;
  
  piVar2 = TPZVec<int>::operator[](in_RSI,0);
  iVar1 = *piVar2 + 1;
  iVar3 = TPZGenMatrix<int>::Rows(in_RDX);
  if (iVar3 != iVar1) {
    pzinternal::DebugStopImpl(in_stack_00000400,in_stack_000003f8);
  }
  piVar2 = TPZGenMatrix<int>::operator()
                     (in_RDX,CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *piVar2 = 1;
  piVar2 = TPZGenMatrix<int>::operator()
                     (in_RDX,CONCAT44(iVar1,in_stack_ffffffffffffffe0),
                      CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *piVar2 = 1;
  iVar4 = 2;
  while (iVar4 < iVar1) {
    iVar5 = iVar4;
    piVar2 = TPZGenMatrix<int>::operator()
                       (in_RDX,CONCAT44(iVar1,iVar4),CONCAT44(iVar4,in_stack_ffffffffffffffd8));
    *piVar2 = iVar4;
    iVar4 = iVar5 + 1;
  }
  return;
}

Assistant:

void TPZShapeLinear::ShapeOrder(const TPZVec<int64_t> &id, const TPZVec<int> &order, TPZGenMatrix<int> &shapeorders)//, TPZVec<int64_t> &sides
    {
        int nshape = 2+(order[0]-1);
        if (shapeorders.Rows() != nshape) {
            DebugStop();
        }
        shapeorders(0,0) = 1;
        shapeorders(1,0) = 1;
        for (int i=2; i<nshape; i++) {
            shapeorders(i,0) = i;
        }
    }